

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::default_cost_type<long_double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (default_cost_type<long_double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  longdouble lVar1;
  longdouble min;
  pointer end;
  default_cost_type<long_double> *pdVar2;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  _Var3;
  longdouble *plVar4;
  ulong p2x;
  long lVar5;
  long lVar6;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  end_00;
  long in_R8;
  pointer ppVar7;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  begin;
  longdouble in_ST0;
  vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> r;
  allocator_type local_71;
  _Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> local_70;
  undefined1 local_58 [24];
  size_type local_40;
  default_cost_type<long_double> *local_38;
  
  std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::vector
            ((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *)
             &local_70,(long)n,&local_71);
  plVar4 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
           super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
           super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
  lVar6 = (ulong)(uint)n << 4;
  p2x = 0;
  for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 0x10) {
    *(unkbyte10 *)((long)&(local_70._M_impl.super__Vector_impl_data._M_start)->first + lVar5 * 2) =
         *(unkbyte10 *)((long)plVar4 + lVar5);
    *(int *)((long)&(local_70._M_impl.super__Vector_impl_data._M_start)->second + lVar5 * 2) =
         (int)p2x;
    p2x = (ulong)((int)p2x + 1);
  }
  local_40 = (long)n;
  local_38 = this;
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
            (local_70._M_impl.super__Vector_impl_data._M_start,
             local_70._M_impl.super__Vector_impl_data._M_finish);
  end = local_70._M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = local_70._M_impl.super__Vector_impl_data._M_start;
  begin._M_current = local_70._M_impl.super__Vector_impl_data._M_start;
  for (end_00._M_current = local_70._M_impl.super__Vector_impl_data._M_start;
      end_00._M_current != end; end_00._M_current = end_00._M_current + 1) {
    lVar1 = (end_00._M_current)->first;
    min = (begin._M_current)->first;
    if (((lVar1 != min) || (_Var3._M_current = begin._M_current, NAN(lVar1) || NAN(min))) &&
       (p2x = (long)ppVar7 - (long)begin._M_current, _Var3._M_current = end_00._M_current,
       0x20 < (long)p2x)) {
      random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                (begin,end_00,rng,min,lVar1);
    }
    ppVar7 = ppVar7 + 1;
    begin._M_current = _Var3._M_current;
  }
  if (0x20 < (long)end - (long)begin._M_current) {
    if ((long)begin._M_current - (long)local_70._M_impl.super__Vector_impl_data._M_start == 0) {
      random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                (begin,(__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                        )end,rng,(begin._M_current)->first,(longdouble)1 + (begin._M_current)->first
                );
    }
    else {
      linearize<long,long_double>
                ((longdouble *)0x0,
                 (baryonyx *)
                 ((long)begin._M_current - (long)local_70._M_impl.super__Vector_impl_data._M_start
                 >> 5),(long)local_70._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_70._M_impl.super__Vector_impl_data._M_start >> 5,
                 (local_70._M_impl.super__Vector_impl_data._M_start)->first,p2x,
                 (begin._M_current)->first,in_R8);
      random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                (begin,(__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                        )end,rng,(begin._M_current)->first,in_ST0);
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
            (local_70._M_impl.super__Vector_impl_data._M_start,
             local_70._M_impl.super__Vector_impl_data._M_finish);
  pdVar2 = local_38;
  plVar4 = (local_38->linear_elements)._M_t.
           super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
           super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
           super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
  for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 0x10) {
    *(unkbyte10 *)((long)plVar4 + lVar5) =
         *(unkbyte10 *)
          ((long)&(local_70._M_impl.super__Vector_impl_data._M_start)->first + lVar5 * 2);
  }
  plVar4 = std::__max_element<long_double*,__gnu_cxx::__ops::_Iter_less_iter>
                     (plVar4,plVar4 + local_40);
  lVar1 = *plVar4;
  local_58._0_8_ = SUB108(lVar1,0);
  local_58._8_2_ = (undefined2)((unkuint10)lVar1 >> 0x40);
  if ((ushort)((local_58._8_2_ & 0x7fff) - 1) < 0x7ffe && (long)local_58._0_8_ < 0) {
    plVar4 = (pdVar2->linear_elements)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
    for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 0x10) {
      *(longdouble *)((long)plVar4 + lVar5) = *(longdouble *)((long)plVar4 + lVar5) / lVar1;
    }
  }
  local_58._0_10_ = lVar1;
  std::_Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
  ~_Vector_base(&local_70);
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        auto begin = r.begin();
        auto end = r.end();
        auto next = r.begin()++;
        for (; next != end; ++next) {
            if (next->first != begin->first) {
                if (std::distance(begin, next) > 1)
                    random_epsilon_unique(
                      begin, next, rng, begin->first, next->first);

                begin = next;
            }
        }

        if (std::distance(begin, end) > 1) {
            if (begin == r.begin()) {
                random_epsilon_unique(
                  begin, end, rng, begin->first, begin->first + 1);
            } else {
                auto value = linearize(std::ptrdiff_t(0),
                                       r.front().first,
                                       std::distance(r.begin(), begin),
                                       begin->first,
                                       std::distance(r.begin(), r.end()));

                random_epsilon_unique(begin, end, rng, begin->first, value);
            }
        }

        // Reorder the vector according to the variable index, so, it
        // restores the initial order.

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.second < rhs.second;
        });

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;

        // Finally we compute the l+oo norm.

        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);
        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }